

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O2

void __thiscall
GCPtr<symbols::Object>::GCPtr(GCPtr<symbols::Object> *this,GCPtr<symbols::Object> *ob)

{
  iterator iVar1;
  
  iVar1 = findPtrInfo(this,ob->addr);
  *(int *)&iVar1._M_node[1]._M_next = *(int *)&iVar1._M_node[1]._M_next + 1;
  this->addr = ob->addr;
  return;
}

Assistant:

GCPtr(const GCPtr &ob){
        typename list<GCInfo<T>>::iterator p;
        p = findPtrInfo(ob.addr);
        p->refcount++; // increment ref count

        addr = ob.addr;
        #ifdef DISPLAY
            cout << "Constructing GCPtr copy." << endl;
        #endif
    }